

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O0

void __thiscall
llvm::SpecificBumpPtrAllocator<wasm::SuffixTreeLeafNode>::DestroyAll
          (SpecificBumpPtrAllocator<wasm::SuffixTreeLeafNode> *this)

{
  void *pvVar1;
  LogValue CA;
  iterator __first;
  difference_type dVar2;
  reference ppvVar3;
  char *Begin_00;
  SmallVector<std::pair<void_*,_unsigned_long>,_0U> *local_a0;
  Align local_79;
  unsigned_long local_78;
  size_t Size;
  void *Ptr;
  pair<void_*,_unsigned_long> *PtrAndSize;
  iterator __end2;
  iterator __begin2;
  SmallVector<std::pair<void_*,_unsigned_long>,_0U> *__range2;
  char *End;
  char *local_38;
  char *Begin;
  size_t AllocatedSlabSize;
  iterator E;
  iterator I;
  SpecificBumpPtrAllocator<wasm::SuffixTreeLeafNode> *pSStack_10;
  anon_class_1_0_00000001 DestroyElements;
  SpecificBumpPtrAllocator<wasm::SuffixTreeLeafNode> *this_local;
  
  pSStack_10 = this;
  E = SmallVectorTemplateCommon<void_*,_void>::begin
                ((SmallVectorTemplateCommon<void_*,_void> *)(this + 0x10));
  AllocatedSlabSize =
       (size_t)SmallVectorTemplateCommon<void_*,_void>::end
                         ((SmallVectorTemplateCommon<void_*,_void> *)(this + 0x10));
  for (; E != (iterator)AllocatedSlabSize; E = E + 1) {
    __first = SmallVectorTemplateCommon<void_*,_void>::begin
                        ((SmallVectorTemplateCommon<void_*,_void> *)(this + 0x10));
    dVar2 = std::distance<void**>(__first,E);
    Begin = (char *)BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::computeSlabSize
                              ((uint)dVar2);
    pvVar1 = *E;
    End._6_1_ = Align::Of<wasm::SuffixTreeLeafNode>();
    Align::Align((Align *)((long)&End + 7),End._6_1_);
    local_38 = (char *)alignAddr(pvVar1,End._7_1_);
    pvVar1 = *E;
    ppvVar3 = SmallVectorTemplateCommon<void_*,_void>::back
                        ((SmallVectorTemplateCommon<void_*,_void> *)(this + 0x10));
    if (pvVar1 == *ppvVar3) {
      local_a0 = *(SmallVector<std::pair<void_*,_unsigned_long>,_0U> **)this;
    }
    else {
      local_a0 = (SmallVector<std::pair<void_*,_unsigned_long>,_0U> *)((long)*E + (long)Begin);
    }
    __range2 = local_a0;
    DestroyAll::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)((long)&I + 7),local_38,(char *)local_a0);
  }
  __begin2 = (iterator)(this + 0x40);
  __end2 = SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>::begin
                     ((SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void> *)__begin2)
  ;
  PtrAndSize = SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>::end
                         ((SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void> *)
                          __begin2);
  for (; __end2 != PtrAndSize; __end2 = __end2 + 1) {
    Ptr = __end2;
    pvVar1 = __end2->first;
    local_78 = __end2->second;
    Size = (size_t)pvVar1;
    CA = Align::Of<wasm::SuffixTreeLeafNode>();
    Align::Align(&local_79,CA);
    Begin_00 = (char *)alignAddr(pvVar1,local_79);
    DestroyAll::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)((long)&I + 7),Begin_00,(char *)(Size + local_78));
  }
  BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Reset
            ((BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *)this);
  return;
}

Assistant:

void DestroyAll() {
    auto DestroyElements = [](char *Begin, char *End) {
      assert(Begin == (char *)alignAddr(Begin, Align::Of<T>()));
      for (char *Ptr = Begin; Ptr + sizeof(T) <= End; Ptr += sizeof(T))
        reinterpret_cast<T *>(Ptr)->~T();
    };

    for (auto I = Allocator.Slabs.begin(), E = Allocator.Slabs.end(); I != E;
         ++I) {
      size_t AllocatedSlabSize = BumpPtrAllocator::computeSlabSize(
          std::distance(Allocator.Slabs.begin(), I));
      char *Begin = (char *)alignAddr(*I, Align::Of<T>());
      char *End = *I == Allocator.Slabs.back() ? Allocator.CurPtr
                                               : (char *)*I + AllocatedSlabSize;

      DestroyElements(Begin, End);
    }

    for (auto &PtrAndSize : Allocator.CustomSizedSlabs) {
      void *Ptr = PtrAndSize.first;
      size_t Size = PtrAndSize.second;
      DestroyElements((char *)alignAddr(Ptr, Align::Of<T>()),
                      (char *)Ptr + Size);
    }

    Allocator.Reset();
  }